

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_jpgd.cpp
# Opt level: O3

void __thiscall jpgd::jpeg_decoder::transform_mcu_expand(jpeg_decoder *this,int mcu_row)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Element_Type EVar5;
  Element_Type EVar6;
  Element_Type EVar7;
  Element_Type EVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  uint8 *pDst_ptr;
  bool bVar15;
  jpgd_block_t *pSrc_ptr;
  Matrix44 P;
  Matrix44 R;
  Matrix44 S;
  Matrix44 Q;
  jpgd_block_t temp_block [64];
  Matrix44 c;
  Matrix44 a;
  Matrix44 local_238;
  Matrix44 local_1f8;
  Matrix44 local_1b8;
  Matrix44 local_178;
  jpgd_block_t local_138 [8];
  short asStack_128 [8];
  short asStack_118 [8];
  short asStack_108 [44];
  int aiStack_b0 [32];
  
  pSrc_ptr = this->m_pMCU_coefficients;
  pDst_ptr = this->m_pSample_buf + mcu_row * this->m_expanded_blocks_per_mcu * 0x40;
  if (this->m_expanded_blocks_per_component < 1) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0;
    do {
      idct(pSrc_ptr,pDst_ptr,this->m_mcu_block_max_zag[lVar14]);
      pSrc_ptr = pSrc_ptr + 0x40;
      pDst_ptr = pDst_ptr + 0x40;
      lVar14 = lVar14 + 1;
    } while (lVar14 < this->m_expanded_blocks_per_component);
  }
  bVar11 = true;
  do {
    bVar15 = bVar11;
    iVar13 = this->m_mcu_block_max_zag[lVar14] + -1;
    if (this->m_mcu_block_max_zag[lVar14] < 2) {
      iVar13 = 0;
    }
    bVar1 = (&s_max_rc)[iVar13];
    if (bVar1 < 0x54) {
      if (bVar1 < 0x32) {
        if (bVar1 == 0x11) {
          local_238.v[0][0] = (int)*pSrc_ptr;
          local_238.v[3][1] = 0;
          local_238.v[3][2] = 0;
          local_238.v[3][3] = 0;
          local_238.v[2][1] = 0;
          local_238.v[2][2] = 0;
          local_238.v[2][3] = 0;
          local_238.v[3][0] = 0;
          local_238.v[1][1] = 0;
          local_238.v[1][2] = 0;
          local_238.v[1][3] = 0;
          local_238.v[2][0] = 0;
          local_238.v[0][1] = 0;
          local_238.v[0][2] = 0;
          local_238.v[0][3] = 0;
          local_238.v[1][0] = 0;
          local_178.v[3][0] = 0;
          local_178.v[3][1] = 0;
          local_178.v[3][2] = 0;
          local_178.v[3][3] = 0;
          local_178.v[2][0] = 0;
          local_178.v[2][1] = 0;
          local_178.v[2][2] = 0;
          local_178.v[2][3] = 0;
          local_178.v[1][0] = 0;
          local_178.v[1][1] = 0;
          local_178.v[1][2] = 0;
          local_178.v[1][3] = 0;
          local_178.v[0][0] = 0;
          local_178.v[0][1] = 0;
          local_178.v[0][2] = 0;
          local_178.v[0][3] = 0;
          local_1f8.v[0][0] = 0;
          local_1f8.v[0][1] = 0;
          local_1f8.v[0][2] = 0;
          local_1f8.v[0][3] = 0;
          local_1f8.v[1][0] = 0;
          local_1f8.v[1][1] = 0;
          local_1f8.v[1][2] = 0;
          local_1f8.v[1][3] = 0;
          local_1f8.v[2][0] = 0;
          local_1f8.v[2][1] = 0;
          local_1f8.v[2][2] = 0;
          local_1f8.v[2][3] = 0;
          local_1f8.v[3][0] = 0;
          local_1f8.v[3][1] = 0;
          local_1f8.v[3][2] = 0;
          local_1f8.v[3][3] = 0;
          local_1b8.v[0][0] = 0;
          local_1b8.v[0][1] = 0;
          local_1b8.v[0][2] = 0;
          local_1b8.v[0][3] = 0;
          local_1b8.v[1][0] = 0;
          local_1b8.v[1][1] = 0;
          local_1b8.v[1][2] = 0;
          local_1b8.v[1][3] = 0;
          local_1b8.v[2][0] = 0;
          local_1b8.v[2][1] = 0;
          local_1b8.v[2][2] = 0;
          local_1b8.v[2][3] = 0;
          local_1b8.v[3][0] = 0;
          local_1b8.v[3][1] = 0;
          local_1b8.v[3][2] = 0;
          local_1b8.v[3][3] = 0;
        }
        else if (bVar1 == 0x12) {
          local_238.v[0][0] = (int)*pSrc_ptr;
          local_238.v[0][1] = 0;
          local_238.v[0][2] = 0;
          local_238.v._12_8_ = (ulong)(uint)(pSrc_ptr[1] * 0x1aa + 0x200 >> 10) << 0x20;
          local_238.v[2][1] = 0;
          local_238.v[2][2] = 0;
          local_238.v[2][3] = 0;
          local_238.v[1][1] = 0;
          local_238.v[1][2] = 0;
          local_238.v[1][3] = 0;
          local_238.v[2][0] = 0;
          local_238.v[3][0] = pSrc_ptr[1] * 0x17 + 0x200 >> 10;
          local_238.v[3][1] = 0;
          local_238.v[3][2] = 0;
          local_238.v[3][3] = 0;
          local_178.v[0][0] = 0;
          local_178.v[0][1] = 0;
          local_178.v[0][2] = 0;
          local_178.v[0][3] = 0;
          local_178.v[1][0] = 0;
          local_178.v[1][1] = 0;
          local_178.v[1][2] = 0;
          local_178.v[1][3] = 0;
          local_178.v[2][0] = 0;
          local_178.v[2][1] = 0;
          local_178.v[2][2] = 0;
          local_178.v[2][3] = 0;
          local_178.v[3][0] = 0;
          local_178.v[3][1] = 0;
          local_178.v[3][2] = 0;
          local_178.v[3][3] = 0;
          local_1f8.v[0][0] = pSrc_ptr[1] * 0x3a0 + 0x200 >> 10;
          local_1f8.v[1][1] = 0;
          local_1f8.v[1][2] = 0;
          local_1f8.v[1][3] = 0;
          local_1f8.v[0][1] = 0;
          local_1f8.v[0][2] = 0;
          local_1f8.v[0][3] = 0;
          local_1f8.v[1][0] = 0;
          local_1f8.v[2][0] = pSrc_ptr[1] * -0x4b + 0x200 >> 10;
          local_1f8.v[3][1] = 0;
          local_1f8.v[3][2] = 0;
          local_1f8.v[3][3] = 0;
          local_1f8.v[2][1] = 0;
          local_1f8.v[2][2] = 0;
          local_1f8.v[2][3] = 0;
          local_1f8.v[3][0] = 0;
          local_1b8.v[3][0] = 0;
          local_1b8.v[3][1] = 0;
          local_1b8.v[3][2] = 0;
          local_1b8.v[3][3] = 0;
          local_1b8.v[2][0] = 0;
          local_1b8.v[2][1] = 0;
          local_1b8.v[2][2] = 0;
          local_1b8.v[2][3] = 0;
          local_1b8.v[1][0] = 0;
          local_1b8.v[1][1] = 0;
          local_1b8.v[1][2] = 0;
          local_1b8.v[1][3] = 0;
          local_1b8.v[0][0] = 0;
          local_1b8.v[0][1] = 0;
          local_1b8.v[0][2] = 0;
          local_1b8.v[0][3] = 0;
        }
        else if (bVar1 == 0x22) {
          DCT_Upsample::P_Q<2,_2>::calc(&local_238,&local_178,pSrc_ptr);
          DCT_Upsample::R_S<2,_2>::calc(&local_1f8,&local_1b8,pSrc_ptr);
        }
      }
      else if (bVar1 < 0x34) {
        if (bVar1 == 0x32) {
          DCT_Upsample::P_Q<3,_2>::calc(&local_238,&local_178,pSrc_ptr);
          DCT_Upsample::R_S<3,_2>::calc(&local_1f8,&local_1b8,pSrc_ptr);
        }
        else if (bVar1 == 0x33) {
          DCT_Upsample::P_Q<3,_3>::calc(&local_238,&local_178,pSrc_ptr);
          DCT_Upsample::R_S<3,_3>::calc(&local_1f8,&local_1b8,pSrc_ptr);
        }
      }
      else if (bVar1 == 0x34) {
        DCT_Upsample::P_Q<3,_4>::calc(&local_238,&local_178,pSrc_ptr);
        DCT_Upsample::R_S<3,_4>::calc(&local_1f8,&local_1b8,pSrc_ptr);
      }
      else if (bVar1 == 0x44) {
        DCT_Upsample::P_Q<4,_4>::calc(&local_238,&local_178,pSrc_ptr);
        DCT_Upsample::R_S<4,_4>::calc(&local_1f8,&local_1b8,pSrc_ptr);
      }
    }
    else if (bVar1 < 0x76) {
      if (bVar1 < 0x56) {
        if (bVar1 == 0x54) {
          DCT_Upsample::P_Q<5,_4>::calc(&local_238,&local_178,pSrc_ptr);
          DCT_Upsample::R_S<5,_4>::calc(&local_1f8,&local_1b8,pSrc_ptr);
        }
        else if (bVar1 == 0x55) {
          DCT_Upsample::P_Q<5,_5>::calc(&local_238,&local_178,pSrc_ptr);
          DCT_Upsample::R_S<5,_5>::calc(&local_1f8,&local_1b8,pSrc_ptr);
        }
      }
      else if (bVar1 == 0x56) {
        DCT_Upsample::P_Q<5,_6>::calc(&local_238,&local_178,pSrc_ptr);
        DCT_Upsample::R_S<5,_6>::calc(&local_1f8,&local_1b8,pSrc_ptr);
      }
      else if (bVar1 == 0x66) {
        DCT_Upsample::P_Q<6,_6>::calc(&local_238,&local_178,pSrc_ptr);
        DCT_Upsample::R_S<6,_6>::calc(&local_1f8,&local_1b8,pSrc_ptr);
      }
    }
    else if (bVar1 < 0x78) {
      if (bVar1 == 0x76) {
        DCT_Upsample::P_Q<7,_6>::calc(&local_238,&local_178,pSrc_ptr);
        DCT_Upsample::R_S<7,_6>::calc(&local_1f8,&local_1b8,pSrc_ptr);
      }
      else if (bVar1 == 0x77) {
        DCT_Upsample::P_Q<7,_7>::calc(&local_238,&local_178,pSrc_ptr);
        DCT_Upsample::R_S<7,_7>::calc(&local_1f8,&local_1b8,pSrc_ptr);
      }
    }
    else if (bVar1 == 0x78) {
      DCT_Upsample::P_Q<7,_8>::calc(&local_238,&local_178,pSrc_ptr);
      DCT_Upsample::R_S<7,_8>::calc(&local_1f8,&local_1b8,pSrc_ptr);
    }
    else if (bVar1 == 0x88) {
      DCT_Upsample::P_Q<8,_8>::calc(&local_238,&local_178,pSrc_ptr);
      DCT_Upsample::R_S<8,_8>::calc(&local_1f8,&local_1b8,pSrc_ptr);
    }
    lVar14 = lVar14 + 1;
    lVar12 = 0;
    do {
      iVar13 = *(int *)((long)local_238.v[0] + lVar12 + 4);
      iVar2 = *(int *)((long)local_238.v[0] + lVar12 + 8);
      iVar3 = *(int *)((long)local_238.v[0] + lVar12 + 0xc);
      iVar4 = *(int *)((long)local_178.v[0] + lVar12 + 4);
      iVar9 = *(int *)((long)local_178.v[0] + lVar12 + 8);
      iVar10 = *(int *)((long)local_178.v[0] + lVar12 + 0xc);
      *(int *)((long)aiStack_b0 + lVar12 + 0x40) =
           *(int *)((long)local_178.v[0] + lVar12) + *(int *)((long)local_238.v[0] + lVar12);
      *(int *)((long)aiStack_b0 + lVar12 + 0x44) = iVar4 + iVar13;
      *(int *)((long)aiStack_b0 + lVar12 + 0x48) = iVar9 + iVar2;
      *(int *)((long)aiStack_b0 + lVar12 + 0x4c) = iVar10 + iVar3;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar12 = 0;
    do {
      iVar13 = *(int *)((long)local_178.v[0] + lVar12 + 4);
      iVar2 = *(int *)((long)local_178.v[0] + lVar12 + 8);
      iVar3 = *(int *)((long)local_178.v[0] + lVar12 + 0xc);
      iVar4 = *(int *)((long)local_238.v[0] + lVar12 + 4);
      iVar9 = *(int *)((long)local_238.v[0] + lVar12 + 8);
      iVar10 = *(int *)((long)local_238.v[0] + lVar12 + 0xc);
      *(int *)((long)local_238.v[0] + lVar12) =
           *(int *)((long)local_238.v[0] + lVar12) - *(int *)((long)local_178.v[0] + lVar12);
      *(int *)((long)local_238.v[0] + lVar12 + 4) = iVar4 - iVar13;
      *(int *)((long)local_238.v[0] + lVar12 + 8) = iVar9 - iVar2;
      *(int *)((long)local_238.v[0] + lVar12 + 0xc) = iVar10 - iVar3;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar12 = 0;
    do {
      iVar13 = *(int *)((long)local_1f8.v[0] + lVar12 + 4);
      iVar2 = *(int *)((long)local_1f8.v[0] + lVar12 + 8);
      iVar3 = *(int *)((long)local_1f8.v[0] + lVar12 + 0xc);
      iVar4 = *(int *)((long)local_1b8.v[0] + lVar12 + 4);
      iVar9 = *(int *)((long)local_1b8.v[0] + lVar12 + 8);
      iVar10 = *(int *)((long)local_1b8.v[0] + lVar12 + 0xc);
      *(int *)((long)aiStack_b0 + lVar12) =
           *(int *)((long)local_1b8.v[0] + lVar12) + *(int *)((long)local_1f8.v[0] + lVar12);
      *(int *)((long)aiStack_b0 + lVar12 + 4) = iVar4 + iVar13;
      *(int *)((long)aiStack_b0 + lVar12 + 8) = iVar9 + iVar2;
      *(int *)((long)aiStack_b0 + lVar12 + 0xc) = iVar10 + iVar3;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar12 = 0;
    do {
      iVar13 = *(int *)((long)local_1b8.v[0] + lVar12 + 4);
      iVar2 = *(int *)((long)local_1b8.v[0] + lVar12 + 8);
      iVar3 = *(int *)((long)local_1b8.v[0] + lVar12 + 0xc);
      iVar4 = *(int *)((long)local_1f8.v[0] + lVar12 + 4);
      iVar9 = *(int *)((long)local_1f8.v[0] + lVar12 + 8);
      iVar10 = *(int *)((long)local_1f8.v[0] + lVar12 + 0xc);
      *(int *)((long)local_1f8.v[0] + lVar12) =
           *(int *)((long)local_1f8.v[0] + lVar12) - *(int *)((long)local_1b8.v[0] + lVar12);
      *(int *)((long)local_1f8.v[0] + lVar12 + 4) = iVar4 - iVar13;
      *(int *)((long)local_1f8.v[0] + lVar12 + 8) = iVar9 - iVar2;
      *(int *)((long)local_1f8.v[0] + lVar12 + 0xc) = iVar10 - iVar3;
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x40);
    lVar12 = 0;
    do {
      iVar13 = aiStack_b0[lVar12 * 2 + 1];
      iVar2 = aiStack_b0[lVar12 * 2 + 0x11];
      *(short *)((long)local_138 + lVar12) =
           (short)aiStack_b0[lVar12 * 2] + (short)aiStack_b0[lVar12 * 2 + 0x10];
      iVar3 = aiStack_b0[lVar12 * 2 + 2];
      iVar4 = aiStack_b0[lVar12 * 2 + 0x12];
      *(short *)((long)asStack_128 + lVar12) = (short)iVar13 + (short)iVar2;
      iVar13 = aiStack_b0[lVar12 * 2 + 3];
      iVar2 = aiStack_b0[lVar12 * 2 + 0x13];
      *(short *)((long)asStack_118 + lVar12) = (short)iVar3 + (short)iVar4;
      *(short *)((long)asStack_108 + lVar12) = (short)iVar13 + (short)iVar2;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 8);
    idct_4x4(local_138,pDst_ptr);
    lVar12 = 0;
    do {
      iVar13 = aiStack_b0[lVar12 * 2 + 0x11];
      iVar2 = aiStack_b0[lVar12 * 2 + 1];
      *(short *)((long)local_138 + lVar12) =
           (short)aiStack_b0[lVar12 * 2 + 0x10] - (short)aiStack_b0[lVar12 * 2];
      iVar3 = aiStack_b0[lVar12 * 2 + 0x12];
      iVar4 = aiStack_b0[lVar12 * 2 + 2];
      *(short *)((long)asStack_128 + lVar12) = (short)iVar13 - (short)iVar2;
      iVar13 = aiStack_b0[lVar12 * 2 + 0x13];
      iVar2 = aiStack_b0[lVar12 * 2 + 3];
      *(short *)((long)asStack_118 + lVar12) = (short)iVar3 - (short)iVar4;
      *(short *)((long)asStack_108 + lVar12) = (short)iVar13 - (short)iVar2;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 8);
    idct_4x4(local_138,pDst_ptr + 0x40);
    lVar12 = 0;
    do {
      EVar5 = local_1f8.v[0][lVar12 * 2 + 1];
      EVar6 = local_238.v[0][lVar12 * 2 + 1];
      *(short *)((long)local_138 + lVar12) =
           (short)local_1f8.v[0][lVar12 * 2] + (short)local_238.v[0][lVar12 * 2];
      EVar7 = local_1f8.v[0][lVar12 * 2 + 2];
      EVar8 = local_238.v[0][lVar12 * 2 + 2];
      *(short *)((long)asStack_128 + lVar12) = (short)EVar5 + (short)EVar6;
      EVar5 = local_1f8.v[0][lVar12 * 2 + 3];
      EVar6 = local_238.v[0][lVar12 * 2 + 3];
      *(short *)((long)asStack_118 + lVar12) = (short)EVar7 + (short)EVar8;
      *(short *)((long)asStack_108 + lVar12) = (short)EVar5 + (short)EVar6;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 8);
    idct_4x4(local_138,pDst_ptr + 0x80);
    lVar12 = 0;
    do {
      EVar5 = local_238.v[0][lVar12 * 2 + 1];
      EVar6 = local_1f8.v[0][lVar12 * 2 + 1];
      *(short *)((long)local_138 + lVar12) =
           (short)local_238.v[0][lVar12 * 2] - (short)local_1f8.v[0][lVar12 * 2];
      EVar7 = local_238.v[0][lVar12 * 2 + 2];
      EVar8 = local_1f8.v[0][lVar12 * 2 + 2];
      *(short *)((long)asStack_128 + lVar12) = (short)EVar5 - (short)EVar6;
      EVar5 = local_238.v[0][lVar12 * 2 + 3];
      EVar6 = local_1f8.v[0][lVar12 * 2 + 3];
      *(short *)((long)asStack_118 + lVar12) = (short)EVar7 - (short)EVar8;
      *(short *)((long)asStack_108 + lVar12) = (short)EVar5 - (short)EVar6;
      lVar12 = lVar12 + 2;
    } while (lVar12 != 8);
    idct_4x4(local_138,pDst_ptr + 0xc0);
    pDst_ptr = pDst_ptr + 0x100;
    pSrc_ptr = pSrc_ptr + 0x40;
    bVar11 = false;
  } while (bVar15);
  return;
}

Assistant:

void jpeg_decoder::transform_mcu_expand(int mcu_row) {
  jpgd_block_t* pSrc_ptr = m_pMCU_coefficients;
  uint8* pDst_ptr = m_pSample_buf + mcu_row * m_expanded_blocks_per_mcu * 64;

  // Y IDCT
  int mcu_block;
  for (mcu_block = 0; mcu_block < m_expanded_blocks_per_component; mcu_block++) {
    idct(pSrc_ptr, pDst_ptr, m_mcu_block_max_zag[mcu_block]);
    pSrc_ptr += 64;
    pDst_ptr += 64;
  }

  // Chroma IDCT, with upsampling
  jpgd_block_t temp_block[64];

  for (int i = 0; i < 2; i++) {
    DCT_Upsample::Matrix44 P, Q, R, S;

    JPGD_ASSERT(m_mcu_block_max_zag[mcu_block] >= 1);
    JPGD_ASSERT(m_mcu_block_max_zag[mcu_block] <= 64);

    int max_zag = m_mcu_block_max_zag[mcu_block++] - 1;
    if (max_zag <= 0)
      max_zag = 0;  // should never happen, only here to shut up static analysis
    switch (s_max_rc[max_zag]) {
      case 1 * 16 + 1:
        DCT_Upsample::P_Q<1, 1>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<1, 1>::calc(R, S, pSrc_ptr);
        break;
      case 1 * 16 + 2:
        DCT_Upsample::P_Q<1, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<1, 2>::calc(R, S, pSrc_ptr);
        break;
      case 2 * 16 + 2:
        DCT_Upsample::P_Q<2, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<2, 2>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 2:
        DCT_Upsample::P_Q<3, 2>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 2>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 3:
        DCT_Upsample::P_Q<3, 3>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 3>::calc(R, S, pSrc_ptr);
        break;
      case 3 * 16 + 4:
        DCT_Upsample::P_Q<3, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<3, 4>::calc(R, S, pSrc_ptr);
        break;
      case 4 * 16 + 4:
        DCT_Upsample::P_Q<4, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<4, 4>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 4:
        DCT_Upsample::P_Q<5, 4>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 4>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 5:
        DCT_Upsample::P_Q<5, 5>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 5>::calc(R, S, pSrc_ptr);
        break;
      case 5 * 16 + 6:
        DCT_Upsample::P_Q<5, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<5, 6>::calc(R, S, pSrc_ptr);
        break;
      case 6 * 16 + 6:
        DCT_Upsample::P_Q<6, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<6, 6>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 6:
        DCT_Upsample::P_Q<7, 6>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 6>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 7:
        DCT_Upsample::P_Q<7, 7>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 7>::calc(R, S, pSrc_ptr);
        break;
      case 7 * 16 + 8:
        DCT_Upsample::P_Q<7, 8>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<7, 8>::calc(R, S, pSrc_ptr);
        break;
      case 8 * 16 + 8:
        DCT_Upsample::P_Q<8, 8>::calc(P, Q, pSrc_ptr);
        DCT_Upsample::R_S<8, 8>::calc(R, S, pSrc_ptr);
        break;
      default:
        JPGD_ASSERT(false);
    }

    DCT_Upsample::Matrix44 a(P + Q);
    P -= Q;
    DCT_Upsample::Matrix44& b = P;
    DCT_Upsample::Matrix44 c(R + S);
    R -= S;
    DCT_Upsample::Matrix44& d = R;

    DCT_Upsample::Matrix44::add_and_store(temp_block, a, c);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::sub_and_store(temp_block, a, c);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::add_and_store(temp_block, b, d);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    DCT_Upsample::Matrix44::sub_and_store(temp_block, b, d);
    idct_4x4(temp_block, pDst_ptr);
    pDst_ptr += 64;

    pSrc_ptr += 64;
  }
}